

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMig.c
# Opt level: O2

Mig_Man_t * Mig_ManStart(void)

{
  Mig_Man_t *p;
  undefined8 *puVar1;
  void **ppvVar2;
  Mig_Obj_t *pMVar3;
  uint uVar4;
  int iVar5;
  int v;
  
  p = (Mig_Man_t *)calloc(1,0xb0);
  Vec_IntGrow(&p->vCis,0x400);
  Vec_IntGrow(&p->vCos,0x400);
  v = p->nObjs;
  if (v == 0x7fffffff) {
    __assert_fail("p->nObjs < MIG_NONE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMig.h"
                  ,0xdc,"Mig_Obj_t *Mig_ManAppendObj(Mig_Man_t *)");
  }
  iVar5 = (p->vPages).nSize;
  if (iVar5 * 0x1000 <= v) {
    if (v != iVar5 * 0x1000) {
      __assert_fail("p->nObjs == (Vec_PtrSize(&p->vPages) << MIG_BASE)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMig.h"
                    ,0xe0,"Mig_Obj_t *Mig_ManAppendObj(Mig_Man_t *)");
    }
    puVar1 = (undefined8 *)malloc(0x10020);
    memset(puVar1 + 1,0xff,0x10018);
    *puVar1 = p;
    if (iVar5 == (p->vPages).nCap) {
      uVar4 = 0x10;
      if (0xf < iVar5) {
        uVar4 = iVar5 * 2;
      }
      if (iVar5 < (int)uVar4) {
        ppvVar2 = (p->vPages).pArray;
        if (ppvVar2 == (void **)0x0) {
          ppvVar2 = (void **)malloc((ulong)uVar4 << 3);
        }
        else {
          ppvVar2 = (void **)realloc(ppvVar2,(ulong)uVar4 << 3);
          v = p->nObjs;
          iVar5 = (p->vPages).nSize;
        }
        (p->vPages).pArray = ppvVar2;
        (p->vPages).nCap = uVar4;
      }
    }
    (p->vPages).nSize = iVar5 + 1;
    (p->vPages).pArray[iVar5] = puVar1 + 2;
  }
  p->nObjs = v + 1;
  pMVar3 = Mig_ManObj(p,v);
  if (0xfffffffd < (uint)pMVar3->pFans[3]) {
    if (0 < p->nObjs) {
      pMVar3->pFans[3] = (Mig_Fan_t)(((uint)pMVar3->pFans[3] & 1) + p->nObjs * 2 + -2);
      return p;
    }
    __assert_fail("v >= 0 && v < MIG_NONE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMig.h"
                  ,0x81,"int Mig_FanSetId(Mig_Obj_t *, int, int)");
  }
  __assert_fail("Mig_ObjIsNone(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMig.h"
                ,0xea,"Mig_Obj_t *Mig_ManAppendObj(Mig_Man_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Mig_Man_t * Mig_ManStart()
{
    Mig_Man_t * p;
    assert( sizeof(Mig_Obj_t) >= 16 );
    assert( (1 << MIG_BASE) == MIG_MASK + 1 );
    p = ABC_CALLOC( Mig_Man_t, 1 );
    Vec_IntGrow( &p->vCis, 1024 );
    Vec_IntGrow( &p->vCos, 1024 );
    Mig_ManAppendObj( p ); // const0
    return p;
}